

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Temp * __thiscall IR::IRBuilder::newTemp(IRBuilder *this,string *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pair<std::_Rb_tree_iterator<IR::Temp>,_bool> pVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  ulong local_28 [3];
  
  local_68._M_dataplus._M_p = (type->_M_dataplus)._M_p;
  paVar1 = &type->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&type->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68._M_string_length = type->_M_string_length;
  (type->_M_dataplus)._M_p = (pointer)paVar1;
  type->_M_string_length = 0;
  (type->field_2)._M_local_buf[0] = '\0';
  uVar2 = this->function_->uniqueTempCount_;
  local_28[0] = (ulong)uVar2;
  this->function_->uniqueTempCount_ = uVar2 + 1;
  format_str.size_ = 2;
  format_str.data_ = (char *)0x4;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  .desc_ = (unsigned_long_long)local_28;
  fmt::v7::detail::vformat_abi_cxx11_(&local_48,(detail *)"yy{}",format_str,args);
  pVar3 = std::
          _Rb_tree<IR::Temp,IR::Temp,std::_Identity<IR::Temp>,std::less<IR::Temp>,std::allocator<IR::Temp>>
          ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                    ((_Rb_tree<IR::Temp,IR::Temp,std::_Identity<IR::Temp>,std::less<IR::Temp>,std::allocator<IR::Temp>>
                      *)&this->function_->temps,&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return (Temp *)(pVar3.first._M_node._M_node + 1);
}

Assistant:

const Temp* IRBuilder::newTemp(std::string type) {
  return getTemp(std::move(type),
                 fmt::format("yy{}", function_->uniqueTempCount_++));
}